

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

int deflateReset(z_streamp strm)

{
  uLong uVar1;
  undefined4 uVar2;
  long in_RDI;
  deflate_state *s;
  uint in_stack_ffffffffffffffdc;
  uchar *in_stack_ffffffffffffffe0;
  unsigned_long crc;
  undefined4 local_4;
  
  if ((((in_RDI == 0) || (*(long *)(in_RDI + 0x38) == 0)) || (*(long *)(in_RDI + 0x40) == 0)) ||
     (*(long *)(in_RDI + 0x48) == 0)) {
    local_4 = -2;
  }
  else {
    *(undefined8 *)(in_RDI + 0x28) = 0;
    *(undefined8 *)(in_RDI + 0x10) = 0;
    *(undefined8 *)(in_RDI + 0x30) = 0;
    *(undefined4 *)(in_RDI + 0x58) = 2;
    crc = *(unsigned_long *)(in_RDI + 0x38);
    *(undefined4 *)(crc + 0x28) = 0;
    *(undefined8 *)(crc + 0x20) = *(undefined8 *)(crc + 0x10);
    if (*(int *)(crc + 0x2c) < 0) {
      *(int *)(crc + 0x2c) = -*(int *)(crc + 0x2c);
    }
    uVar2 = 0x71;
    if (*(int *)(crc + 0x2c) != 0) {
      uVar2 = 0x2a;
    }
    *(undefined4 *)(crc + 8) = uVar2;
    if (*(int *)(crc + 0x2c) == 2) {
      uVar1 = crc32(crc,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
    }
    else {
      uVar1 = adler32(0,(Bytef *)0x0,0);
    }
    *(uLong *)(in_RDI + 0x60) = uVar1;
    *(undefined4 *)(crc + 0x40) = 0;
    _tr_init((deflate_state *)0x1c5b35);
    lm_init((deflate_state *)0x1c5b3f);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int ZEXPORT deflateReset (strm)
    z_streamp strm;
{
    deflate_state *s;

    if (strm == Z_NULL || strm->state == Z_NULL ||
        strm->zalloc == (alloc_func)0 || strm->zfree == (free_func)0) {
        return Z_STREAM_ERROR;
    }

    strm->total_in = strm->total_out = 0;
    strm->msg = Z_NULL; /* use zfree if we ever allocate msg dynamically */
    strm->data_type = Z_UNKNOWN;

    s = (deflate_state *)strm->state;
    s->pending = 0;
    s->pending_out = s->pending_buf;

    if (s->wrap < 0) {
        s->wrap = -s->wrap; /* was made negative by deflate(..., Z_FINISH); */
    }
    s->status = s->wrap ? INIT_STATE : BUSY_STATE;
    strm->adler =
#ifdef GZIP
        s->wrap == 2 ? crc32(0L, Z_NULL, 0) :
#endif
        adler32(0L, Z_NULL, 0);
    s->last_flush = Z_NO_FLUSH;

    _tr_init(s);
    lm_init(s);

    return Z_OK;
}